

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O2

void __thiscall duckdb::DataChunk::Deserialize(DataChunk *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  Allocator *allocator;
  undefined4 extraout_var_00;
  reference this_00;
  idx_t capacity_p;
  idx_t i;
  size_type __n;
  long lVar3;
  ulong count;
  bool bVar4;
  vector<duckdb::LogicalType,_true> types;
  type local_48;
  
  uVar1 = Deserializer::ReadProperty<unsigned_int>(deserializer,100,"rows");
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"types");
  iVar2 = (*deserializer->_vptr_Deserializer[8])(deserializer);
  lVar3 = CONCAT44(extraout_var,iVar2);
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    Deserializer::Read<duckdb::LogicalType>(&local_48,deserializer);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &local_48);
    LogicalType::~LogicalType(&local_48);
  }
  (*deserializer->_vptr_Deserializer[9])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  allocator = Allocator::DefaultAllocator();
  count = (ulong)uVar1;
  capacity_p = 0x800;
  if (0x800 < count) {
    capacity_p = count;
  }
  Initialize(this,allocator,&types,capacity_p);
  this->count = count;
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"columns");
  iVar2 = (*deserializer->_vptr_Deserializer[8])(deserializer);
  for (__n = 0; CONCAT44(extraout_var_00,iVar2) != __n; __n = __n + 1) {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    this_00 = vector<duckdb::Vector,_true>::get<true>(&this->data,__n);
    Vector::Deserialize(this_00,deserializer,count);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[9])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return;
}

Assistant:

void DataChunk::Deserialize(Deserializer &deserializer) {

	// read and set the row count
	auto row_count = deserializer.ReadProperty<sel_t>(100, "rows");

	// read the types
	vector<LogicalType> types;
	deserializer.ReadList(101, "types", [&](Deserializer::List &list, idx_t i) {
		auto type = list.ReadElement<LogicalType>();
		types.push_back(type);
	});

	// initialize the data chunk
	D_ASSERT(!types.empty());
	Initialize(Allocator::DefaultAllocator(), types, MaxValue<idx_t>(row_count, STANDARD_VECTOR_SIZE));
	SetCardinality(row_count);

	// read the data
	deserializer.ReadList(102, "columns", [&](Deserializer::List &list, idx_t i) {
		list.ReadObject([&](Deserializer &object) { data[i].Deserialize(object, row_count); });
	});
}